

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPoolPrivate::reset(QThreadPoolPrivate *this)

{
  long lVar1;
  bool bVar2;
  QThreadPoolThread **ppQVar3;
  long in_FS_OFFSET;
  QThreadPoolThread *thread;
  add_const_t<QSet<QThreadPoolThread_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QSet<QThreadPoolThread_*> allThreadsCopy;
  TimerType in_stack_ffffffffffffff48;
  ForeverConstant in_stack_ffffffffffffff4c;
  QThreadPoolThread *in_stack_ffffffffffffff50;
  QThreadPoolThread *pQVar4;
  QThreadPoolThread *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QSet<QThreadPoolThread_*> *in_stack_ffffffffffffff68;
  void *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QThreadPoolThread_*>::QSet((QSet<QThreadPoolThread_*> *)0x6cb088);
  std::exchange<QSet<QThreadPoolThread*>,QSet<QThreadPoolThread*>>
            ((QSet<QThreadPoolThread_*> *)in_stack_ffffffffffffff58,
             (QSet<QThreadPoolThread_*> *)in_stack_ffffffffffffff50);
  QSet<QThreadPoolThread_*>::~QSet((QSet<QThreadPoolThread_*> *)0x6cb0ae);
  QList<QThreadPoolThread_*>::clear((QList<QThreadPoolThread_*> *)in_stack_ffffffffffffff50);
  QList<QThreadPoolThread_*>::clear((QList<QThreadPoolThread_*> *)in_stack_ffffffffffffff50);
  QBasicMutex::unlock((QBasicMutex *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  QSet<QThreadPoolThread_*>::begin(in_stack_ffffffffffffff68);
  QSet<QThreadPoolThread_*>::end(in_stack_ffffffffffffff68);
  while (bVar2 = QSet<QThreadPoolThread_*>::const_iterator::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff50,
                            (const_iterator *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)), bVar2) {
    ppQVar3 = QSet<QThreadPoolThread_*>::const_iterator::operator*((const_iterator *)0x6cb193);
    pQVar4 = *ppQVar3;
    bVar2 = QThread::isRunning(&in_stack_ffffffffffffff58->super_QThread);
    if (bVar2) {
      QWaitCondition::wakeAll((QWaitCondition *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff58 = pQVar4;
      QDeadlineTimer::QDeadlineTimer
                ((QDeadlineTimer *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48);
      QThread::wait(&in_stack_ffffffffffffff58->super_QThread,local_48);
    }
    in_stack_ffffffffffffff50 = pQVar4;
    if (pQVar4 != (QThreadPoolThread *)0x0) {
      (*(pQVar4->super_QThread).super_QObject._vptr_QObject[4])();
      in_stack_ffffffffffffff50 = pQVar4;
    }
    QSet<QThreadPoolThread_*>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff50);
  }
  QBasicMutex::lock((QBasicMutex *)in_stack_ffffffffffffff50);
  QSet<QThreadPoolThread_*>::~QSet((QSet<QThreadPoolThread_*> *)0x6cb298);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadPoolPrivate::reset()
{
    // move the contents of the set out so that we can iterate without the lock
    auto allThreadsCopy = std::exchange(allThreads, {});
    expiredThreads.clear();
    waitingThreads.clear();

    mutex.unlock();

    for (QThreadPoolThread *thread : std::as_const(allThreadsCopy)) {
        if (thread->isRunning()) {
            thread->runnableReady.wakeAll();
            thread->wait();
        }
        delete thread;
    }

    mutex.lock();
}